

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O2

void lj_trace_ins(jit_State *J,BCIns *pc)

{
  int iVar1;
  GCfunc *pGVar2;
  GCproto *pGVar3;
  lua_State *plVar4;
  
  J->pc = pc;
  plVar4 = J->L;
  pGVar2 = (GCfunc *)(ulong)plVar4->base[-1].u32.lo;
  J->fn = pGVar2;
  if ((pGVar2->c).ffid == '\0') {
    pGVar3 = (GCproto *)((ulong)(pGVar2->c).pc.ptr32 - 0x40);
  }
  else {
    pGVar3 = (GCproto *)0x0;
  }
  J->pt = pGVar3;
  while( true ) {
    iVar1 = lj_vm_cpcall(plVar4,0,J,trace_state);
    if (iVar1 == 0) break;
    J->state = LJ_TRACE_ERR;
    plVar4 = J->L;
  }
  return;
}

Assistant:

void lj_trace_ins(jit_State *J, const BCIns *pc)
{
  /* Note: J->L must already be set. pc is the true bytecode PC here. */
  J->pc = pc;
  J->fn = curr_func(J->L);
  J->pt = isluafunc(J->fn) ? funcproto(J->fn) : NULL;
  while (lj_vm_cpcall(J->L, NULL, (void *)J, trace_state) != 0)
    J->state = LJ_TRACE_ERR;
}